

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_16x16(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  INT32 tmp17;
  INT32 tmp16;
  INT32 tmp15;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp7;
  INT32 tmp6;
  INT32 tmp5;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_1b4;
  int *local_1a8;
  int *local_1a0;
  int local_198 [8];
  int local_178 [8];
  int local_158 [8];
  int local_138 [8];
  int local_118 [8];
  int local_f8 [8];
  int local_d8 [8];
  int local_b8 [8];
  long local_98;
  long local_90;
  long local_88;
  long lStack_80;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  uint local_14;
  long local_10;
  int *local_8;
  
  local_1b4 = 0;
  local_1a0 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    while( true ) {
      pbVar1 = (byte *)(*(long *)(local_10 + (long)local_1b4 * 8) + (ulong)local_14);
      local_60 = (long)(int)((uint)*pbVar1 + (uint)pbVar1[0xf]) +
                 (long)(int)((uint)pbVar1[7] + (uint)pbVar1[8]);
      lStack_80 = (long)(int)((uint)*pbVar1 + (uint)pbVar1[0xf]) -
                  (long)(int)((uint)pbVar1[7] + (uint)pbVar1[8]);
      dataptr = (DCTELEM *)
                ((long)(int)((uint)pbVar1[1] + (uint)pbVar1[0xe]) +
                (long)(int)((uint)pbVar1[6] + (uint)pbVar1[9]));
      local_88 = (long)(int)((uint)pbVar1[1] + (uint)pbVar1[0xe]) -
                 (long)(int)((uint)pbVar1[6] + (uint)pbVar1[9]);
      wsptr = (DCTELEM *)
              ((long)(int)((uint)pbVar1[2] + (uint)pbVar1[0xd]) +
              (long)(int)((uint)pbVar1[5] + (uint)pbVar1[10]));
      local_90 = (long)(int)((uint)pbVar1[2] + (uint)pbVar1[0xd]) -
                 (long)(int)((uint)pbVar1[5] + (uint)pbVar1[10]);
      elemptr = (JSAMPROW)
                ((long)(int)((uint)pbVar1[3] + (uint)pbVar1[0xc]) +
                (long)(int)((uint)pbVar1[4] + (uint)pbVar1[0xb]));
      local_98 = (long)(int)((uint)pbVar1[3] + (uint)pbVar1[0xc]) -
                 (long)(int)((uint)pbVar1[4] + (uint)pbVar1[0xb]);
      local_20 = (long)(int)((uint)*pbVar1 - (uint)pbVar1[0xf]);
      local_28 = (long)(int)((uint)pbVar1[1] - (uint)pbVar1[0xe]);
      local_30 = (long)(int)((uint)pbVar1[2] - (uint)pbVar1[0xd]);
      local_38 = (long)(int)((uint)pbVar1[3] - (uint)pbVar1[0xc]);
      local_40 = (long)(int)((uint)pbVar1[4] - (uint)pbVar1[0xb]);
      local_48 = (long)(int)((uint)pbVar1[5] - (uint)pbVar1[10]);
      local_50 = (long)(int)((uint)pbVar1[6] - (uint)pbVar1[9]);
      local_58 = (long)(int)((uint)pbVar1[7] - (uint)pbVar1[8]);
      *local_1a0 = ((int)local_60 + (int)dataptr + (int)wsptr + (int)elemptr + -0x800) * 4;
      local_1a0[4] = (int)((local_60 - (long)elemptr) * 0x29cf +
                           ((long)dataptr - (long)wsptr) * 0x1151 + 0x400 >> 0xb);
      local_60 = (local_98 - local_88) * 0x8d4 + (lStack_80 - local_90) * 0x2c63;
      local_1a0[2] = (int)(local_60 + local_88 * 0x2e75 + local_90 * 0x4587 + 0x400 >> 0xb);
      local_1a0[6] = (int)(local_60 + lStack_80 * -0x6c2 + local_98 * -0x21f9 + 0x400 >> 0xb);
      lVar2 = (local_20 + local_28) * 0x2b4e + (local_50 - local_58) * 0xd23;
      lVar3 = (local_20 + local_30) * 0x27e9 + (local_48 + local_58) * 0x1555;
      lVar4 = (local_20 + local_38) * 0x22fc + (local_40 - local_58) * 0x1cb6;
      lVar5 = (local_28 + local_30) * 0x470 + (local_50 - local_48) * 0x2d09;
      lVar6 = (local_28 + local_38) * -0x1555 + (local_40 + local_50) * -0x27e9;
      lVar7 = (local_30 + local_38) * -0x2b4e + (local_48 - local_40) * 0xd23;
      dataptr = (DCTELEM *)(lVar5 + lVar6 + local_28 * 0x24d + local_50 * -0x353f + lVar2);
      wsptr = (DCTELEM *)(lVar5 + lVar7 + local_30 * -0x2406 + local_48 * 0x2747 + lVar3);
      elemptr = (JSAMPROW)(lVar6 + lVar7 + local_38 * 0x2218 + local_40 * 0x4560 + lVar4);
      local_1a0[1] = (int)(lVar2 + lVar3 + lVar4 + local_20 * -0x492a + local_58 * 0x18f3 + 0x400 >>
                          0xb);
      local_1a0[3] = (int)((long)(dataptr + 0x100) >> 0xb);
      local_1a0[5] = (int)((long)(wsptr + 0x100) >> 0xb);
      local_1a0[7] = (int)((long)(elemptr + 0x400) >> 0xb);
      local_1b4 = local_1b4 + 1;
      if (local_1b4 != 8) break;
      local_1a0 = local_198;
    }
    if (local_1b4 == 0x10) break;
    local_1a0 = local_1a0 + 8;
  }
  local_1a0 = local_8;
  local_1a8 = local_198;
  for (local_1b4 = 7; -1 < local_1b4; local_1b4 = local_1b4 + -1) {
    lVar2 = (long)(*local_1a0 + local_1a8[0x38]) + (long)(local_1a0[0x38] + *local_1a8);
    lVar3 = (long)(*local_1a0 + local_1a8[0x38]) - (long)(local_1a0[0x38] + *local_1a8);
    lVar4 = (long)(local_1a0[8] + local_1a8[0x30]) + (long)(local_1a0[0x30] + local_1a8[8]);
    lVar5 = (long)(local_1a0[8] + local_1a8[0x30]) - (long)(local_1a0[0x30] + local_1a8[8]);
    lVar6 = (long)(local_1a0[0x10] + local_1a8[0x28]) + (long)(local_1a0[0x28] + local_1a8[0x10]);
    lVar7 = (long)(local_1a0[0x10] + local_1a8[0x28]) - (long)(local_1a0[0x28] + local_1a8[0x10]);
    lVar8 = (long)(local_1a0[0x18] + local_1a8[0x20]) + (long)(local_1a0[0x20] + local_1a8[0x18]);
    lVar9 = (long)(local_1a0[0x18] + local_1a8[0x20]) - (long)(local_1a0[0x20] + local_1a8[0x18]);
    lVar10 = (long)(*local_1a0 - local_1a8[0x38]);
    lVar11 = (long)(local_1a0[8] - local_1a8[0x30]);
    lVar12 = (long)(local_1a0[0x10] - local_1a8[0x28]);
    lVar13 = (long)(local_1a0[0x18] - local_1a8[0x20]);
    lVar14 = (long)(local_1a0[0x20] - local_1a8[0x18]);
    lVar15 = (long)(local_1a0[0x28] - local_1a8[0x10]);
    lVar16 = (long)(local_1a0[0x30] - local_1a8[8]);
    lVar17 = (long)(local_1a0[0x38] - *local_1a8);
    *local_1a0 = (int)(lVar2 + lVar4 + lVar6 + lVar8 + 8 >> 4);
    local_1a0[0x20] = (int)((lVar2 - lVar8) * 0x29cf + (lVar4 - lVar6) * 0x1151 + 0x10000 >> 0x11);
    lVar2 = (lVar9 - lVar5) * 0x8d4 + (lVar3 - lVar7) * 0x2c63;
    local_1a0[0x10] = (int)(lVar2 + lVar5 * 0x2e75 + lVar7 * 0x4587 + 0x10000 >> 0x11);
    local_1a0[0x30] = (int)(lVar2 + lVar3 * -0x6c2 + lVar9 * -0x21f9 + 0x10000 >> 0x11);
    lVar2 = (lVar10 + lVar11) * 0x2b4e + (lVar16 - lVar17) * 0xd23;
    lVar3 = (lVar10 + lVar12) * 0x27e9 + (lVar15 + lVar17) * 0x1555;
    lVar4 = (lVar10 + lVar13) * 0x22fc + (lVar14 - lVar17) * 0x1cb6;
    lVar5 = (lVar11 + lVar12) * 0x470 + (lVar16 - lVar15) * 0x2d09;
    lVar6 = (lVar11 + lVar13) * -0x1555 + (lVar14 + lVar16) * -0x27e9;
    lVar7 = (lVar12 + lVar13) * -0x2b4e + (lVar15 - lVar14) * 0xd23;
    local_1a0[8] = (int)(lVar2 + lVar3 + lVar4 + lVar10 * -0x492a + lVar17 * 0x18f3 + 0x10000 >>
                        0x11);
    local_1a0[0x18] =
         (int)(lVar5 + lVar6 + lVar11 * 0x24d + lVar16 * -0x353f + lVar2 + 0x10000 >> 0x11);
    local_1a0[0x28] =
         (int)(lVar5 + lVar7 + lVar12 * -0x2406 + lVar15 * 0x2747 + lVar3 + 0x10000 >> 0x11);
    local_1a0[0x38] =
         (int)(lVar6 + lVar7 + lVar13 * 0x2218 + lVar14 * 0x4560 + lVar4 + 0x10000 >> 0x11);
    local_1a0 = local_1a0 + 1;
    local_1a8 = local_1a8 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_16x16 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16, tmp17;
  DCTELEM workspace[DCTSIZE2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* cK represents sqrt(2) * cos(K*pi/32). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) + GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) + GETJSAMPLE(elemptr[8]);

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) - GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) - GETJSAMPLE(elemptr[8]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 + tmp13 - 16 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS-PASS1_BITS);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+c10 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == DCTSIZE * 2)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/16)**2 = 1/2**2.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] + wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] + wsptr[DCTSIZE*0];

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] - wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] - wsptr[DCTSIZE*0];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(tmp10 + tmp11 + tmp12 + tmp13, PASS1_BITS+2);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS+PASS1_BITS+2);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+10 */
	      CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS+PASS1_BITS+2);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+PASS1_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}